

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUpDownButton.cpp
# Opt level: O3

void __thiscall QUpDownButtonPrivate::updateButtonArrows(QUpDownButtonPrivate *this)

{
  Direction direction;
  Orientation OVar1;
  
  direction = QBoxLayout::direction();
  OVar1 = directionToOrientation(this,direction);
  if ((OVar1 != Horizontal) && (OVar1 != Vertical)) {
    return;
  }
  QToolButton::setArrowType((ArrowType)this->upButton);
  QToolButton::setArrowType((ArrowType)this->downButton);
  return;
}

Assistant:

void updateButtonArrows() {
        switch (directionToOrientation(layout->direction())) {
        case Qt::Horizontal:
            upButton->setArrowType(Qt::LeftArrow);
            downButton->setArrowType(Qt::RightArrow);
            break;
        case Qt::Vertical:
            upButton->setArrowType(Qt::UpArrow);
            downButton->setArrowType(Qt::DownArrow);
            break;
        }
    }